

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_is_this_a_copy(char *urltype)

{
  int iVar1;
  char *pcVar2;
  char *in_RDI;
  int iscopy;
  uint local_c;
  
  iVar1 = strncmp(in_RDI,"mem",3);
  if (iVar1 == 0) {
    local_c = 1;
  }
  else {
    iVar1 = strncmp(in_RDI,"compress",8);
    if (iVar1 == 0) {
      local_c = 1;
    }
    else {
      iVar1 = strncmp(in_RDI,"http",4);
      if (iVar1 == 0) {
        local_c = 1;
      }
      else {
        iVar1 = strncmp(in_RDI,"ftp",3);
        if (iVar1 == 0) {
          local_c = 1;
        }
        else {
          iVar1 = strncmp(in_RDI,"gsiftp",6);
          if (iVar1 == 0) {
            local_c = 1;
          }
          else {
            pcVar2 = strncpy(in_RDI,"stdin",5);
            local_c = (uint)(pcVar2 == (char *)0x0);
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

int fits_is_this_a_copy(char *urltype) /* I - type of file */
/*
  specialized routine that returns 1 if the file is known to be a temporary
  copy of the originally opened file.  Otherwise it returns 0.
*/
{
  int iscopy;

  if (!strncmp(urltype, "mem", 3) )
     iscopy = 1;    /* file copy is in memory */
  else if (!strncmp(urltype, "compress", 8) )
     iscopy = 1;    /* compressed diskfile that is uncompressed in memory */
  else if (!strncmp(urltype, "http", 4) )
     iscopy = 1;    /* copied file using http protocol */
  else if (!strncmp(urltype, "ftp", 3) )
     iscopy = 1;    /* copied file using ftp protocol */
  else if (!strncmp(urltype, "gsiftp", 6) )
     iscopy = 1;    /* copied file using gsiftp protocol */
  else if (!strncpy(urltype, "stdin", 5) )
     iscopy = 1;    /* piped stdin has been copied to memory */
  else
     iscopy = 0;    /* file is not known to be a copy */
 
    return(iscopy);
}